

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
djb::matrix::eigenvector
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,matrix *this,
          int iterations)

{
  vector<double,_std::allocator<double>_> *out;
  double dVar1;
  int iVar2;
  pointer pdVar3;
  undefined1 auVar4 [16];
  long lVar5;
  uint uVar6;
  ulong uVar7;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  vector<double,_std::allocator<double>_> vec [2];
  undefined1 local_68 [24];
  undefined1 auStack_50 [32];
  ulong uVar8;
  long lVar12;
  
  auStack_50._8_16_ = (undefined1  [16])0x0;
  stack0xffffffffffffffa8 = (undefined1  [16])0x0;
  local_68._0_16_ = (undefined1  [16])0x0;
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)local_68,(long)this->size);
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)auStack_50,(long)this->size);
  auVar4 = _DAT_001b21e0;
  iVar2 = this->size;
  if (0 < (long)iVar2) {
    lVar5 = (long)iVar2 + -1;
    auVar10._8_4_ = (int)lVar5;
    auVar10._0_8_ = lVar5;
    auVar10._12_4_ = (int)((ulong)lVar5 >> 0x20);
    lVar5 = 0;
    auVar10 = auVar10 ^ _DAT_001b21e0;
    auVar11 = _DAT_001b2270;
    do {
      auVar13 = auVar11 ^ auVar4;
      if ((bool)(~(auVar13._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar13._0_4_ ||
                  auVar10._4_4_ < auVar13._4_4_) & 1)) {
        *(undefined8 *)(local_68._0_8_ + lVar5) = 0x3ff0000000000000;
      }
      if ((auVar13._12_4_ != auVar10._12_4_ || auVar13._8_4_ <= auVar10._8_4_) &&
          auVar13._12_4_ <= auVar10._12_4_) {
        *(undefined8 *)(local_68._0_8_ + lVar5 + 8) = 0x3ff0000000000000;
      }
      lVar12 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 2;
      auVar11._8_8_ = lVar12 + 2;
      lVar5 = lVar5 + 0x10;
    } while ((ulong)(iVar2 + 1U >> 1) << 4 != lVar5);
  }
  uVar7 = 0;
  if (0 < iterations) {
    uVar8 = uVar7;
    uVar7 = 0;
    do {
      lVar5 = uVar7 * 0x18;
      uVar7 = (ulong)(1 - (int)uVar7);
      out = (vector<double,_std::allocator<double>_> *)(local_68 + uVar7 * 0x18);
      transform(this,(vector<double,_std::allocator<double>_> *)(local_68 + lVar5),out);
      if (0 < (long)this->size) {
        dVar9 = 0.0;
        lVar5 = 0;
        do {
          dVar1 = (out->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar5];
          dVar9 = dVar9 + dVar1 * dVar1;
          lVar5 = lVar5 + 1;
        } while (this->size != lVar5);
        if (0.0 < dVar9) {
          if (dVar9 < 0.0) {
            dVar9 = sqrt(dVar9);
          }
          else {
            dVar9 = SQRT(dVar9);
          }
          iVar2 = this->size;
          if (0 < (long)iVar2) {
            pdVar3 = (out->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            lVar5 = 0;
            do {
              pdVar3[lVar5] = pdVar3[lVar5] * (1.0 / dVar9);
              lVar5 = lVar5 + 1;
            } while (iVar2 != lVar5);
          }
        }
      }
      uVar6 = (int)uVar8 + 1;
      uVar8 = (ulong)uVar6;
    } while (uVar6 != iterations);
  }
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,
             (vector<double,_std::allocator<double>_> *)(local_68 + uVar7 * 0x18));
  lVar5 = 0x18;
  do {
    if (*(void **)(local_68 + lVar5) != (void *)0x0) {
      operator_delete(*(void **)(local_68 + lVar5));
    }
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> matrix::eigenvector(int iterations) const
{
	std::vector<double> vec[2];
	int j = 0;

	vec[0].reserve(size);
	vec[1].reserve(size);

	for (int i = 0; i < size; ++i)
		vec[j][i] = 1.0;
	for (int i = 0; i < iterations; ++i) {
		double nrm = 0;

		transform(vec[j], vec[1-j]);

#if 1
		// normalize the vector
		for (int k = 0; k < size; ++k)
			nrm+= sqr(vec[1-j][k]);
		if (nrm > 0) {
			nrm = inversesqrt(nrm);

			for (int k = 0; k < size; ++k)
				vec[1-j][k]*= nrm;
		}
#endif

		j = 1 - j;
	}

	return vec[j];
}